

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O3

FxExpression * __thiscall FxUnaryNotBitwise::Resolve(FxUnaryNotBitwise *this,FCompileContext *ctx)

{
  PString *pPVar1;
  PInt *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  FxIntCast *this_00;
  FxExpression *pFVar4;
  uint uVar5;
  TArray<FxJumpStatement_*,_FxJumpStatement_*> *other;
  FString local_30;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->Operand != (FxExpression *)0x0) {
    iVar3 = (*this->Operand->_vptr_FxExpression[2])();
    pFVar4 = (FxExpression *)CONCAT44(extraout_var,iVar3);
    this->Operand = pFVar4;
    if (pFVar4 != (FxExpression *)0x0) {
      iVar3 = (*(pFVar4->ValueType->super_DObject)._vptr_DObject[0x12])();
      if (iVar3 == 1) {
        this_00 = (FxIntCast *)operator_new(0x40);
        pFVar4 = this->Operand;
        FxExpression::FxExpression((FxExpression *)this_00,&pFVar4->ScriptPosition);
        (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxIntCast_0088e4d0;
        this_00->basex = pFVar4;
        (this_00->super_FxExpression).ValueType = (PType *)TypeSInt32;
        this->Operand = (FxExpression *)this_00;
        pFVar4 = FxIntCast::Resolve(this_00,ctx);
        this->Operand = pFVar4;
        if (pFVar4 == (FxExpression *)0x0) goto LAB_0068e912;
      }
      else {
        pFVar4 = this->Operand;
      }
      iVar3 = (*(pFVar4->ValueType->super_DObject)._vptr_DObject[0x12])();
      if (iVar3 == 0) {
        iVar3 = (*this->Operand->_vptr_FxExpression[3])();
        if ((char)iVar3 == '\0') {
          (this->super_FxExpression).ValueType = (PType *)TypeSInt32;
          return &this->super_FxExpression;
        }
        pPVar1 = (PString *)this->Operand[1]._vptr_FxExpression;
        other = &this->Operand[1].JumpAddresses;
        if (pPVar1 == TypeString) {
          FString::AttachToOther(&local_30,(FString *)other);
        }
        else {
          local_30.Chars = (char *)other->Array;
        }
        iVar3 = (*(pPVar1->super_PBasicType).super_PType.super_DObject._vptr_DObject[0x12])();
        if (iVar3 == 1) {
          uVar5 = (uint)(double)local_30.Chars;
        }
        else {
          uVar5 = 0;
          if (iVar3 == 0) {
            uVar5 = (uint)local_30.Chars;
          }
        }
        if (pPVar1 == TypeString) {
          FString::~FString(&local_30);
        }
        pFVar4 = (FxExpression *)operator_new(0x48);
        FxExpression::FxExpression(pFVar4,&(this->super_FxExpression).ScriptPosition);
        pFVar4->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0088f2f0;
        pPVar2 = TypeSInt32;
        *(PInt **)(pFVar4 + 1) = TypeSInt32;
        pFVar4->ValueType = (PType *)pPVar2;
        *(uint *)&pFVar4[1].JumpAddresses.Array = ~uVar5;
        pFVar4->isresolved = true;
      }
      else {
        pFVar4 = (FxExpression *)0x0;
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,"Integer type expected");
      }
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      return pFVar4;
    }
  }
LAB_0068e912:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxUnaryNotBitwise::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Operand, ctx);

	if  (Operand->ValueType->GetRegType() == REGT_FLOAT /* lax */)
	{
		// DECORATE allows floats here so cast them to int.
		Operand = new FxIntCast(Operand);
		Operand = Operand->Resolve(ctx);
		if (Operand == NULL) 
		{
			delete this;
			return NULL;
		}
	}

	if (Operand->ValueType->GetRegType() != REGT_INT)
	{
		ScriptPosition.Message(MSG_ERROR, "Integer type expected");
		delete this;
		return NULL;
	}

	if (Operand->isConstant())
	{
		int result = ~static_cast<FxConstant *>(Operand)->GetValue().GetInt();
		FxExpression *e = new FxConstant(result, ScriptPosition);
		delete this;
		return e;
	}
	ValueType = TypeSInt32;
	return this;
}